

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flatcc_emitter.h
# Opt level: O0

void * flatcc_emitter_get_direct_buffer(flatcc_emitter_t *E,size_t *size_out)

{
  size_t *size_out_local;
  flatcc_emitter_t *E_local;
  
  if (E->front == E->back) {
    if (size_out != (size_t *)0x0) {
      *size_out = E->used;
    }
    E_local = (flatcc_emitter_t *)E->front_cursor;
  }
  else {
    if (size_out != (size_t *)0x0) {
      *size_out = 0;
    }
    E_local = (flatcc_emitter_t *)0x0;
  }
  return E_local;
}

Assistant:

static inline void *flatcc_emitter_get_direct_buffer(flatcc_emitter_t *E, size_t *size_out)
{
    if (E->front == E->back) {
        if (size_out) {
            *size_out = E->used;
        }
        return E->front_cursor;
    }
    if (size_out) {
        *size_out = 0;
    }
    return 0;
}